

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastq_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserFastqTest_FormatError_Test::BioparserFastqTest_FormatError_Test
          (BioparserFastqTest_FormatError_Test *this)

{
  BioparserFastqTest_FormatError_Test *this_local;
  
  BioparserFastqTest::BioparserFastqTest(&this->super_BioparserFastqTest);
  (this->super_BioparserFastqTest).super_Test._vptr_Test =
       (_func_int **)&PTR__BioparserFastqTest_FormatError_Test_001a9cc0;
  return;
}

Assistant:

TEST_F(BioparserFastqTest, FormatError) {
  Setup("sample.fasta");
  try {
    s = p->Parse(-1);
  } catch (std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[bioparser::FastqParser] error: invalid file format");
  }
}